

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_avx2.c
# Opt level: O1

void av1_build_compound_diffwtd_mask_d16_avx2
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,CONV_BUF_TYPE *src0,int src0_stride,
               CONV_BUF_TYPE *src1,int src1_stride,int h,int w,ConvolveParams *conv_params,int bd)

{
  int iVar1;
  uint uVar2;
  undefined1 (*pauVar3) [32];
  undefined7 in_register_00000031;
  undefined1 (*pauVar4) [32];
  long lVar5;
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar31 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  
  uVar2 = (bd - (conv_params->round_0 + conv_params->round_1)) + 6;
  auVar7._0_2_ = (undefined2)((uint)(1 << ((byte)uVar2 & 0x1f)) >> 1);
  auVar7._2_2_ = auVar7._0_2_;
  auVar7._4_2_ = auVar7._0_2_;
  auVar7._6_2_ = auVar7._0_2_;
  auVar7._8_2_ = auVar7._0_2_;
  auVar7._10_2_ = auVar7._0_2_;
  auVar7._12_2_ = auVar7._0_2_;
  auVar7._14_2_ = auVar7._0_2_;
  auVar7._16_2_ = auVar7._0_2_;
  auVar7._18_2_ = auVar7._0_2_;
  auVar7._20_2_ = auVar7._0_2_;
  auVar7._22_2_ = auVar7._0_2_;
  auVar7._24_2_ = auVar7._0_2_;
  auVar7._26_2_ = auVar7._0_2_;
  auVar7._28_2_ = auVar7._0_2_;
  auVar7._30_2_ = auVar7._0_2_;
  lVar5 = (long)src0_stride;
  if ((int)CONCAT71(in_register_00000031,mask_type) == 0) {
    if (w < 0x10) {
      if (w == 4) {
        lVar6 = 0;
        auVar20._8_2_ = 0x1a;
        auVar20._0_8_ = 0x1a001a001a001a;
        auVar20._10_2_ = 0x1a;
        auVar20._12_2_ = 0x1a;
        auVar20._14_2_ = 0x1a;
        auVar20._16_2_ = 0x1a;
        auVar20._18_2_ = 0x1a;
        auVar20._20_2_ = 0x1a;
        auVar20._22_2_ = 0x1a;
        auVar20._24_2_ = 0x1a;
        auVar20._26_2_ = 0x1a;
        auVar20._28_2_ = 0x1a;
        auVar20._30_2_ = 0x1a;
        auVar31._8_2_ = 0x26;
        auVar31._0_8_ = 0x26002600260026;
        auVar31._10_2_ = 0x26;
        auVar31._12_2_ = 0x26;
        auVar31._14_2_ = 0x26;
        auVar31._16_2_ = 0x26;
        auVar31._18_2_ = 0x26;
        auVar31._20_2_ = 0x26;
        auVar31._22_2_ = 0x26;
        auVar31._24_2_ = 0x26;
        auVar31._26_2_ = 0x26;
        auVar31._28_2_ = 0x26;
        auVar31._30_2_ = 0x26;
        do {
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)((long)src0 + (long)(src0_stride * 3) * 2);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)((long)src0 + (long)(src0_stride * 2) * 2);
          auVar8 = vpunpcklqdq_avx(auVar39,auVar8);
          auVar40._8_8_ = 0;
          auVar40._0_8_ = *(ulong *)((long)src0 + lVar5 * 2);
          auVar45._8_8_ = 0;
          auVar45._0_8_ = *(ulong *)src0;
          auVar39 = vpunpcklqdq_avx(auVar45,auVar40);
          auVar50._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar39;
          auVar50._16_16_ = ZEXT116(1) * auVar8;
          auVar41._8_8_ = 0;
          auVar41._0_8_ = *(ulong *)((long)src1 + (long)(src1_stride * 3) * 2);
          auVar46._8_8_ = 0;
          auVar46._0_8_ = *(ulong *)((long)src1 + (long)(src1_stride * 2) * 2);
          auVar8 = vpunpcklqdq_avx(auVar46,auVar41);
          auVar47._8_8_ = 0;
          auVar47._0_8_ = *(ulong *)((long)src1 + (long)src1_stride * 2);
          auVar51._8_8_ = 0;
          auVar51._0_8_ = *(ulong *)src1;
          auVar39 = vpunpcklqdq_avx(auVar51,auVar47);
          auVar53._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar39;
          auVar53._16_16_ = ZEXT116(1) * auVar8;
          auVar35 = vpsubusw_avx2(auVar50,auVar53);
          auVar50 = vpsubusw_avx2(auVar53,auVar50);
          auVar35 = vpmaxuw_avx2(auVar35,auVar50);
          auVar35 = vpaddusw_avx2(auVar35,auVar7);
          auVar35 = vpsrlw_avx2(auVar35,ZEXT416(uVar2));
          auVar35 = vpsrlw_avx2(auVar35,4);
          auVar35 = vpminsw_avx2(auVar35,auVar20);
          auVar35 = vpaddw_avx2(auVar35,auVar31);
          auVar8 = vpackuswb_avx(auVar35._0_16_,auVar35._16_16_);
          *(undefined1 (*) [16])(mask + lVar6 * 4) = auVar8;
          lVar6 = lVar6 + 4;
          src1 = (CONV_BUF_TYPE *)((long)src1 + (long)(src1_stride << 2) * 2);
          src0 = (CONV_BUF_TYPE *)((long)src0 + (long)(src0_stride << 2) * 2);
        } while ((int)lVar6 < h);
        return;
      }
      if (w == 8) {
        lVar6 = 0;
        auVar35._8_2_ = 0x1a;
        auVar35._0_8_ = 0x1a001a001a001a;
        auVar35._10_2_ = 0x1a;
        auVar35._12_2_ = 0x1a;
        auVar35._14_2_ = 0x1a;
        auVar35._16_2_ = 0x1a;
        auVar35._18_2_ = 0x1a;
        auVar35._20_2_ = 0x1a;
        auVar35._22_2_ = 0x1a;
        auVar35._24_2_ = 0x1a;
        auVar35._26_2_ = 0x1a;
        auVar35._28_2_ = 0x1a;
        auVar35._30_2_ = 0x1a;
        auVar23._8_2_ = 0x26;
        auVar23._0_8_ = 0x26002600260026;
        auVar23._10_2_ = 0x26;
        auVar23._12_2_ = 0x26;
        auVar23._14_2_ = 0x26;
        auVar23._16_2_ = 0x26;
        auVar23._18_2_ = 0x26;
        auVar23._20_2_ = 0x26;
        auVar23._22_2_ = 0x26;
        auVar23._24_2_ = 0x26;
        auVar23._26_2_ = 0x26;
        auVar23._28_2_ = 0x26;
        auVar23._30_2_ = 0x26;
        do {
          auVar33._0_16_ =
               ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + lVar5 * 2) +
               ZEXT116(1) * *(undefined1 (*) [16])src0;
          auVar33._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + lVar5 * 2);
          auVar43._0_16_ =
               ZEXT116(0) *
               *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + (long)(src0_stride * 3) * 2) +
               ZEXT116(1) *
               *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + (long)(src0_stride * 2) * 2);
          auVar43._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) *
               *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + (long)(src0_stride * 3) * 2);
          auVar49._0_16_ =
               ZEXT116(0) *
               *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)src1_stride * 2) +
               ZEXT116(1) * *(undefined1 (*) [16])src1;
          auVar49._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) *
               *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)src1_stride * 2);
          auVar52._0_16_ =
               ZEXT116(0) *
               *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)(src1_stride * 3) * 2) +
               ZEXT116(1) *
               *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)(src1_stride * 2) * 2);
          auVar52._16_16_ =
               ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
               ZEXT116(1) *
               *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)(src1_stride * 3) * 2);
          auVar20 = vpsubusw_avx2(auVar33,auVar49);
          auVar31 = vpsubusw_avx2(auVar49,auVar33);
          auVar20 = vpmaxuw_avx2(auVar20,auVar31);
          auVar20 = vpaddusw_avx2(auVar20,auVar7);
          auVar20 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
          auVar20 = vpsrlw_avx2(auVar20,4);
          auVar20 = vpminsw_avx2(auVar20,auVar35);
          auVar20 = vpaddw_avx2(auVar20,auVar23);
          auVar31 = vpsubusw_avx2(auVar43,auVar52);
          auVar50 = vpsubusw_avx2(auVar52,auVar43);
          auVar31 = vpmaxuw_avx2(auVar31,auVar50);
          auVar31 = vpaddusw_avx2(auVar31,auVar7);
          auVar31 = vpsrlw_avx2(auVar31,ZEXT416(uVar2));
          auVar31 = vpsrlw_avx2(auVar31,4);
          auVar31 = vpminsw_avx2(auVar31,auVar35);
          auVar31 = vpaddw_avx2(auVar31,auVar23);
          auVar20 = vpackuswb_avx2(auVar20,auVar31);
          auVar20 = vpermq_avx2(auVar20,0xd8);
          *(undefined1 (*) [32])(mask + lVar6 * 8) = auVar20;
          lVar6 = lVar6 + 4;
          src1 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src1 + (long)(src1_stride << 2) * 2);
          src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src0 + (long)(src0_stride << 2) * 2);
        } while ((int)lVar6 < h);
        return;
      }
    }
    else {
      if (w == 0x10) {
        iVar1 = 0;
        auVar16._8_2_ = 0x1a;
        auVar16._0_8_ = 0x1a001a001a001a;
        auVar16._10_2_ = 0x1a;
        auVar16._12_2_ = 0x1a;
        auVar16._14_2_ = 0x1a;
        auVar16._16_2_ = 0x1a;
        auVar16._18_2_ = 0x1a;
        auVar16._20_2_ = 0x1a;
        auVar16._22_2_ = 0x1a;
        auVar16._24_2_ = 0x1a;
        auVar16._26_2_ = 0x1a;
        auVar16._28_2_ = 0x1a;
        auVar16._30_2_ = 0x1a;
        auVar25._8_2_ = 0x26;
        auVar25._0_8_ = 0x26002600260026;
        auVar25._10_2_ = 0x26;
        auVar25._12_2_ = 0x26;
        auVar25._14_2_ = 0x26;
        auVar25._16_2_ = 0x26;
        auVar25._18_2_ = 0x26;
        auVar25._20_2_ = 0x26;
        auVar25._22_2_ = 0x26;
        auVar25._24_2_ = 0x26;
        auVar25._26_2_ = 0x26;
        auVar25._28_2_ = 0x26;
        auVar25._30_2_ = 0x26;
        do {
          auVar20 = vpsubusw_avx2(*(undefined1 (*) [32])src0,*(undefined1 (*) [32])src1);
          auVar31 = vpsubusw_avx2(*(undefined1 (*) [32])src1,*(undefined1 (*) [32])src0);
          auVar20 = vpmaxuw_avx2(auVar20,auVar31);
          auVar20 = vpaddusw_avx2(auVar20,auVar7);
          auVar20 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
          auVar20 = vpsrlw_avx2(auVar20,4);
          auVar31 = vpminsw_avx2(auVar20,auVar16);
          auVar20 = vpsubusw_avx2(*(undefined1 (*) [32])(*(undefined1 (*) [32])src0 + lVar5 * 2),
                                  *(undefined1 (*) [32])
                                   (*(undefined1 (*) [32])src1 + (long)src1_stride * 2));
          auVar35 = vpsubusw_avx2(*(undefined1 (*) [32])
                                   (*(undefined1 (*) [32])src1 + (long)src1_stride * 2),
                                  *(undefined1 (*) [32])(*(undefined1 (*) [32])src0 + lVar5 * 2));
          auVar20 = vpmaxuw_avx2(auVar20,auVar35);
          auVar20 = vpaddusw_avx2(auVar20,auVar7);
          auVar35 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
          auVar20 = vpaddw_avx2(auVar31,auVar25);
          auVar31 = vpsrlw_avx2(auVar35,4);
          auVar31 = vpminsw_avx2(auVar31,auVar16);
          auVar31 = vpaddw_avx2(auVar31,auVar25);
          auVar20 = vpackuswb_avx2(auVar20,auVar31);
          auVar20 = vpermq_avx2(auVar20,0xd8);
          *(undefined1 (*) [32])mask = auVar20;
          mask = (uint8_t *)((long)mask + 0x20);
          iVar1 = iVar1 + 2;
          src1 = (CONV_BUF_TYPE *)(*(undefined1 (*) [32])src1 + (long)(src1_stride * 2) * 2);
          src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [32])src0 + (long)(src0_stride * 2) * 2);
        } while (iVar1 < h);
        return;
      }
      if (w == 0x20) {
        iVar1 = 1;
        if (1 < h) {
          iVar1 = h;
        }
        pauVar4 = (undefined1 (*) [32])(src1 + 0x10);
        pauVar3 = (undefined1 (*) [32])(src0 + 0x10);
        auVar17._8_2_ = 0x1a;
        auVar17._0_8_ = 0x1a001a001a001a;
        auVar17._10_2_ = 0x1a;
        auVar17._12_2_ = 0x1a;
        auVar17._14_2_ = 0x1a;
        auVar17._16_2_ = 0x1a;
        auVar17._18_2_ = 0x1a;
        auVar17._20_2_ = 0x1a;
        auVar17._22_2_ = 0x1a;
        auVar17._24_2_ = 0x1a;
        auVar17._26_2_ = 0x1a;
        auVar17._28_2_ = 0x1a;
        auVar17._30_2_ = 0x1a;
        auVar26._8_2_ = 0x26;
        auVar26._0_8_ = 0x26002600260026;
        auVar26._10_2_ = 0x26;
        auVar26._12_2_ = 0x26;
        auVar26._14_2_ = 0x26;
        auVar26._16_2_ = 0x26;
        auVar26._18_2_ = 0x26;
        auVar26._20_2_ = 0x26;
        auVar26._22_2_ = 0x26;
        auVar26._24_2_ = 0x26;
        auVar26._26_2_ = 0x26;
        auVar26._28_2_ = 0x26;
        auVar26._30_2_ = 0x26;
        do {
          auVar20 = vpsubusw_avx2(pauVar3[-1],pauVar4[-1]);
          auVar31 = vpsubusw_avx2(pauVar4[-1],pauVar3[-1]);
          auVar20 = vpmaxuw_avx2(auVar20,auVar31);
          auVar20 = vpaddusw_avx2(auVar20,auVar7);
          auVar20 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
          auVar20 = vpsrlw_avx2(auVar20,4);
          auVar20 = vpminsw_avx2(auVar20,auVar17);
          auVar20 = vpaddw_avx2(auVar20,auVar26);
          auVar31 = vpsubusw_avx2(*pauVar3,*pauVar4);
          auVar35 = vpsubusw_avx2(*pauVar4,*pauVar3);
          auVar31 = vpmaxuw_avx2(auVar31,auVar35);
          auVar31 = vpaddusw_avx2(auVar31,auVar7);
          auVar31 = vpsrlw_avx2(auVar31,ZEXT416(uVar2));
          auVar31 = vpsrlw_avx2(auVar31,4);
          auVar31 = vpminsw_avx2(auVar31,auVar17);
          auVar31 = vpaddw_avx2(auVar31,auVar26);
          auVar20 = vpackuswb_avx2(auVar20,auVar31);
          auVar20 = vpermq_avx2(auVar20,0xd8);
          *(undefined1 (*) [32])mask = auVar20;
          mask = (uint8_t *)((long)mask + 0x20);
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + (long)src1_stride * 2);
          pauVar3 = (undefined1 (*) [32])(*pauVar3 + lVar5 * 2);
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
        return;
      }
      if (w == 0x40) {
        iVar1 = 1;
        if (1 < h) {
          iVar1 = h;
        }
        pauVar4 = (undefined1 (*) [32])(src1 + 0x30);
        pauVar3 = (undefined1 (*) [32])(src0 + 0x30);
        auVar10._8_2_ = 0x1a;
        auVar10._0_8_ = 0x1a001a001a001a;
        auVar10._10_2_ = 0x1a;
        auVar10._12_2_ = 0x1a;
        auVar10._14_2_ = 0x1a;
        auVar10._16_2_ = 0x1a;
        auVar10._18_2_ = 0x1a;
        auVar10._20_2_ = 0x1a;
        auVar10._22_2_ = 0x1a;
        auVar10._24_2_ = 0x1a;
        auVar10._26_2_ = 0x1a;
        auVar10._28_2_ = 0x1a;
        auVar10._30_2_ = 0x1a;
        auVar21._8_2_ = 0x26;
        auVar21._0_8_ = 0x26002600260026;
        auVar21._10_2_ = 0x26;
        auVar21._12_2_ = 0x26;
        auVar21._14_2_ = 0x26;
        auVar21._16_2_ = 0x26;
        auVar21._18_2_ = 0x26;
        auVar21._20_2_ = 0x26;
        auVar21._22_2_ = 0x26;
        auVar21._24_2_ = 0x26;
        auVar21._26_2_ = 0x26;
        auVar21._28_2_ = 0x26;
        auVar21._30_2_ = 0x26;
        do {
          auVar20 = vpsubusw_avx2(pauVar3[-3],pauVar4[-3]);
          auVar31 = vpsubusw_avx2(pauVar4[-3],pauVar3[-3]);
          auVar20 = vpmaxuw_avx2(auVar20,auVar31);
          auVar20 = vpaddusw_avx2(auVar20,auVar7);
          auVar20 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
          auVar20 = vpsrlw_avx2(auVar20,4);
          auVar31 = vpminsw_avx2(auVar20,auVar10);
          auVar20 = vpsubusw_avx2(pauVar3[-2],pauVar4[-2]);
          auVar35 = vpsubusw_avx2(pauVar4[-2],pauVar3[-2]);
          auVar20 = vpmaxuw_avx2(auVar20,auVar35);
          auVar20 = vpaddusw_avx2(auVar20,auVar7);
          auVar35 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
          auVar20 = vpaddw_avx2(auVar31,auVar21);
          auVar31 = vpsrlw_avx2(auVar35,4);
          auVar31 = vpminsw_avx2(auVar31,auVar10);
          auVar31 = vpaddw_avx2(auVar31,auVar21);
          auVar20 = vpackuswb_avx2(auVar20,auVar31);
          auVar31 = vpsubusw_avx2(pauVar3[-1],pauVar4[-1]);
          auVar35 = vpsubusw_avx2(pauVar4[-1],pauVar3[-1]);
          auVar31 = vpmaxuw_avx2(auVar31,auVar35);
          auVar31 = vpaddusw_avx2(auVar31,auVar7);
          auVar31 = vpsrlw_avx2(auVar31,ZEXT416(uVar2));
          auVar31 = vpsrlw_avx2(auVar31,4);
          auVar31 = vpminsw_avx2(auVar31,auVar10);
          auVar31 = vpaddw_avx2(auVar31,auVar21);
          auVar35 = vpsubusw_avx2(*pauVar3,*pauVar4);
          auVar50 = vpsubusw_avx2(*pauVar4,*pauVar3);
          auVar35 = vpmaxuw_avx2(auVar35,auVar50);
          auVar35 = vpaddusw_avx2(auVar35,auVar7);
          auVar35 = vpsrlw_avx2(auVar35,ZEXT416(uVar2));
          auVar35 = vpsrlw_avx2(auVar35,4);
          auVar35 = vpminsw_avx2(auVar35,auVar10);
          auVar35 = vpaddw_avx2(auVar35,auVar21);
          auVar31 = vpackuswb_avx2(auVar31,auVar35);
          auVar20 = vpermq_avx2(auVar20,0xd8);
          *(undefined1 (*) [32])mask = auVar20;
          auVar20 = vpermq_avx2(auVar31,0xd8);
          *(undefined1 (*) [32])((long)mask + 0x20) = auVar20;
          mask = (uint8_t *)((long)mask + 0x40);
          pauVar4 = (undefined1 (*) [32])(*pauVar4 + (long)src1_stride * 2);
          pauVar3 = (undefined1 (*) [32])(*pauVar3 + lVar5 * 2);
          iVar1 = iVar1 + -1;
        } while (iVar1 != 0);
        return;
      }
    }
    iVar1 = 1;
    if (1 < h) {
      iVar1 = h;
    }
    pauVar4 = (undefined1 (*) [32])(src1 + 0x70);
    pauVar3 = (undefined1 (*) [32])(src0 + 0x70);
    auVar18._8_2_ = 0x1a;
    auVar18._0_8_ = 0x1a001a001a001a;
    auVar18._10_2_ = 0x1a;
    auVar18._12_2_ = 0x1a;
    auVar18._14_2_ = 0x1a;
    auVar18._16_2_ = 0x1a;
    auVar18._18_2_ = 0x1a;
    auVar18._20_2_ = 0x1a;
    auVar18._22_2_ = 0x1a;
    auVar18._24_2_ = 0x1a;
    auVar18._26_2_ = 0x1a;
    auVar18._28_2_ = 0x1a;
    auVar18._30_2_ = 0x1a;
    auVar27._8_2_ = 0x26;
    auVar27._0_8_ = 0x26002600260026;
    auVar27._10_2_ = 0x26;
    auVar27._12_2_ = 0x26;
    auVar27._14_2_ = 0x26;
    auVar27._16_2_ = 0x26;
    auVar27._18_2_ = 0x26;
    auVar27._20_2_ = 0x26;
    auVar27._22_2_ = 0x26;
    auVar27._24_2_ = 0x26;
    auVar27._26_2_ = 0x26;
    auVar27._28_2_ = 0x26;
    auVar27._30_2_ = 0x26;
    do {
      auVar20 = vpsubusw_avx2(pauVar3[-7],pauVar4[-7]);
      auVar31 = vpsubusw_avx2(pauVar4[-7],pauVar3[-7]);
      auVar20 = vpmaxuw_avx2(auVar20,auVar31);
      auVar31 = vpsubusw_avx2(pauVar3[-6],pauVar4[-6]);
      auVar35 = vpsubusw_avx2(pauVar4[-6],pauVar3[-6]);
      auVar31 = vpmaxuw_avx2(auVar31,auVar35);
      auVar20 = vpaddusw_avx2(auVar20,auVar7);
      auVar20 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
      auVar20 = vpsrlw_avx2(auVar20,4);
      auVar20 = vpminsw_avx2(auVar20,auVar18);
      auVar20 = vpaddw_avx2(auVar20,auVar27);
      auVar31 = vpaddusw_avx2(auVar31,auVar7);
      auVar31 = vpsrlw_avx2(auVar31,ZEXT416(uVar2));
      auVar31 = vpsrlw_avx2(auVar31,4);
      auVar31 = vpminsw_avx2(auVar31,auVar18);
      auVar31 = vpaddw_avx2(auVar31,auVar27);
      auVar20 = vpackuswb_avx2(auVar20,auVar31);
      auVar31 = vpsubusw_avx2(pauVar3[-5],pauVar4[-5]);
      auVar35 = vpsubusw_avx2(pauVar4[-5],pauVar3[-5]);
      auVar31 = vpmaxuw_avx2(auVar31,auVar35);
      auVar35 = vpsubusw_avx2(pauVar3[-4],pauVar4[-4]);
      auVar50 = vpsubusw_avx2(pauVar4[-4],pauVar3[-4]);
      auVar35 = vpmaxuw_avx2(auVar35,auVar50);
      auVar31 = vpaddusw_avx2(auVar31,auVar7);
      auVar8 = ZEXT416(uVar2);
      auVar31 = vpsrlw_avx2(auVar31,auVar8);
      auVar31 = vpsrlw_avx2(auVar31,4);
      auVar31 = vpminsw_avx2(auVar31,auVar18);
      auVar31 = vpaddw_avx2(auVar31,auVar27);
      auVar35 = vpaddusw_avx2(auVar35,auVar7);
      auVar35 = vpsrlw_avx2(auVar35,auVar8);
      auVar35 = vpsrlw_avx2(auVar35,4);
      auVar35 = vpminsw_avx2(auVar35,auVar18);
      auVar35 = vpaddw_avx2(auVar35,auVar27);
      auVar31 = vpackuswb_avx2(auVar31,auVar35);
      auVar35 = vpsubusw_avx2(pauVar3[-3],pauVar4[-3]);
      auVar50 = vpsubusw_avx2(pauVar4[-3],pauVar3[-3]);
      auVar35 = vpmaxuw_avx2(auVar35,auVar50);
      auVar50 = vpsubusw_avx2(pauVar3[-2],pauVar4[-2]);
      auVar53 = vpsubusw_avx2(pauVar4[-2],pauVar3[-2]);
      auVar50 = vpmaxuw_avx2(auVar50,auVar53);
      auVar35 = vpaddusw_avx2(auVar35,auVar7);
      auVar35 = vpsrlw_avx2(auVar35,auVar8);
      auVar35 = vpsrlw_avx2(auVar35,4);
      auVar35 = vpminsw_avx2(auVar35,auVar18);
      auVar35 = vpaddw_avx2(auVar35,auVar27);
      auVar50 = vpaddusw_avx2(auVar50,auVar7);
      auVar50 = vpsrlw_avx2(auVar50,auVar8);
      auVar50 = vpsrlw_avx2(auVar50,4);
      auVar50 = vpminsw_avx2(auVar50,auVar18);
      auVar50 = vpaddw_avx2(auVar50,auVar27);
      auVar35 = vpackuswb_avx2(auVar35,auVar50);
      auVar50 = vpsubusw_avx2(pauVar3[-1],pauVar4[-1]);
      auVar53 = vpsubusw_avx2(pauVar4[-1],pauVar3[-1]);
      auVar50 = vpmaxuw_avx2(auVar50,auVar53);
      auVar53 = vpsubusw_avx2(*pauVar3,*pauVar4);
      auVar23 = vpsubusw_avx2(*pauVar4,*pauVar3);
      auVar53 = vpmaxuw_avx2(auVar53,auVar23);
      auVar50 = vpaddusw_avx2(auVar50,auVar7);
      auVar50 = vpsrlw_avx2(auVar50,ZEXT416(uVar2));
      auVar50 = vpsrlw_avx2(auVar50,4);
      auVar50 = vpminsw_avx2(auVar50,auVar18);
      auVar50 = vpaddw_avx2(auVar50,auVar27);
      auVar53 = vpaddusw_avx2(auVar53,auVar7);
      auVar53 = vpsrlw_avx2(auVar53,ZEXT416(uVar2));
      auVar53 = vpsrlw_avx2(auVar53,4);
      auVar53 = vpminsw_avx2(auVar53,auVar18);
      auVar53 = vpaddw_avx2(auVar53,auVar27);
      auVar50 = vpackuswb_avx2(auVar50,auVar53);
      auVar20 = vpermq_avx2(auVar20,0xd8);
      *(undefined1 (*) [32])mask = auVar20;
      auVar20 = vpermq_avx2(auVar31,0xd8);
      *(undefined1 (*) [32])((long)mask + 0x20) = auVar20;
      auVar20 = vpermq_avx2(auVar35,0xd8);
      *(undefined1 (*) [32])((long)mask + 0x40) = auVar20;
      auVar20 = vpermq_avx2(auVar50,0xd8);
      *(undefined1 (*) [32])((long)mask + 0x60) = auVar20;
      mask = (uint8_t *)((long)mask + 0x80);
      pauVar4 = (undefined1 (*) [32])(*pauVar4 + (long)src1_stride * 2);
      pauVar3 = (undefined1 (*) [32])(*pauVar3 + lVar5 * 2);
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    return;
  }
  if (w < 0x10) {
    if (w == 4) {
      lVar6 = 0;
      auVar14._8_2_ = 0x1a;
      auVar14._0_8_ = 0x1a001a001a001a;
      auVar14._10_2_ = 0x1a;
      auVar14._12_2_ = 0x1a;
      auVar14._14_2_ = 0x1a;
      auVar14._16_2_ = 0x1a;
      auVar14._18_2_ = 0x1a;
      auVar14._20_2_ = 0x1a;
      auVar14._22_2_ = 0x1a;
      auVar14._24_2_ = 0x1a;
      auVar14._26_2_ = 0x1a;
      auVar14._28_2_ = 0x1a;
      auVar14._30_2_ = 0x1a;
      do {
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)((long)src0 + (long)(src0_stride * 3) * 2);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)((long)src0 + (long)(src0_stride * 2) * 2);
        auVar8 = vpunpcklqdq_avx(auVar28,auVar19);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)((long)src0 + lVar5 * 2);
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)src0;
        auVar39 = vpunpcklqdq_avx(auVar36,auVar29);
        auVar24._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar39;
        auVar24._16_16_ = ZEXT116(1) * auVar8;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)((long)src1 + (long)(src1_stride * 3) * 2);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)((long)src1 + (long)(src1_stride * 2) * 2);
        auVar8 = vpunpcklqdq_avx(auVar37,auVar30);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)((long)src1 + (long)src1_stride * 2);
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)src1;
        auVar39 = vpunpcklqdq_avx(auVar44,auVar38);
        auVar34._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar39;
        auVar34._16_16_ = ZEXT116(1) * auVar8;
        auVar20 = vpsubusw_avx2(auVar24,auVar34);
        auVar31 = vpsubusw_avx2(auVar34,auVar24);
        auVar20 = vpmaxuw_avx2(auVar20,auVar31);
        auVar20 = vpaddusw_avx2(auVar20,auVar7);
        auVar20 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
        auVar20 = vpsrlw_avx2(auVar20,4);
        auVar20 = vpminsw_avx2(auVar20,auVar14);
        auVar20 = vpsubw_avx2(auVar14,auVar20);
        auVar8 = vpackuswb_avx(auVar20._0_16_,auVar20._16_16_);
        *(undefined1 (*) [16])(mask + lVar6 * 4) = auVar8;
        lVar6 = lVar6 + 4;
        src1 = (CONV_BUF_TYPE *)((long)src1 + (long)(src1_stride << 2) * 2);
        src0 = (CONV_BUF_TYPE *)((long)src0 + (long)(src0_stride << 2) * 2);
      } while ((int)lVar6 < h);
      return;
    }
    if (w == 8) {
      lVar6 = 0;
      auVar11._8_2_ = 0x1a;
      auVar11._0_8_ = 0x1a001a001a001a;
      auVar11._10_2_ = 0x1a;
      auVar11._12_2_ = 0x1a;
      auVar11._14_2_ = 0x1a;
      auVar11._16_2_ = 0x1a;
      auVar11._18_2_ = 0x1a;
      auVar11._20_2_ = 0x1a;
      auVar11._22_2_ = 0x1a;
      auVar11._24_2_ = 0x1a;
      auVar11._26_2_ = 0x1a;
      auVar11._28_2_ = 0x1a;
      auVar11._30_2_ = 0x1a;
      do {
        auVar22._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + lVar5 * 2) +
             ZEXT116(1) * *(undefined1 (*) [16])src0;
        auVar22._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + lVar5 * 2);
        auVar32._0_16_ =
             ZEXT116(0) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + (long)(src0_stride * 3) * 2) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + (long)(src0_stride * 2) * 2);
        auVar32._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src0 + (long)(src0_stride * 3) * 2);
        auVar42._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)src1_stride * 2)
             + ZEXT116(1) * *(undefined1 (*) [16])src1;
        auVar42._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)src1_stride * 2)
        ;
        auVar48._0_16_ =
             ZEXT116(0) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)(src1_stride * 3) * 2) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)(src1_stride * 2) * 2);
        auVar48._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) *
             *(undefined1 (*) [16])(*(undefined1 (*) [16])src1 + (long)(src1_stride * 3) * 2);
        auVar20 = vpsubusw_avx2(auVar22,auVar42);
        auVar31 = vpsubusw_avx2(auVar42,auVar22);
        auVar20 = vpmaxuw_avx2(auVar20,auVar31);
        auVar20 = vpaddusw_avx2(auVar20,auVar7);
        auVar20 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
        auVar20 = vpsrlw_avx2(auVar20,4);
        auVar20 = vpminsw_avx2(auVar20,auVar11);
        auVar31 = vpsubw_avx2(auVar11,auVar20);
        auVar20 = vpsubusw_avx2(auVar32,auVar48);
        auVar35 = vpsubusw_avx2(auVar48,auVar32);
        auVar20 = vpmaxuw_avx2(auVar20,auVar35);
        auVar20 = vpaddusw_avx2(auVar20,auVar7);
        auVar20 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
        auVar20 = vpsrlw_avx2(auVar20,4);
        auVar20 = vpminsw_avx2(auVar20,auVar11);
        auVar20 = vpsubw_avx2(auVar11,auVar20);
        auVar20 = vpackuswb_avx2(auVar31,auVar20);
        auVar20 = vpermq_avx2(auVar20,0xd8);
        *(undefined1 (*) [32])(mask + lVar6 * 8) = auVar20;
        lVar6 = lVar6 + 4;
        src1 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src1 + (long)(src1_stride << 2) * 2);
        src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [16])src0 + (long)(src0_stride << 2) * 2);
      } while ((int)lVar6 < h);
      return;
    }
  }
  else {
    if (w == 0x10) {
      iVar1 = 0;
      auVar12._8_2_ = 0x1a;
      auVar12._0_8_ = 0x1a001a001a001a;
      auVar12._10_2_ = 0x1a;
      auVar12._12_2_ = 0x1a;
      auVar12._14_2_ = 0x1a;
      auVar12._16_2_ = 0x1a;
      auVar12._18_2_ = 0x1a;
      auVar12._20_2_ = 0x1a;
      auVar12._22_2_ = 0x1a;
      auVar12._24_2_ = 0x1a;
      auVar12._26_2_ = 0x1a;
      auVar12._28_2_ = 0x1a;
      auVar12._30_2_ = 0x1a;
      do {
        auVar20 = vpsubusw_avx2(*(undefined1 (*) [32])src0,*(undefined1 (*) [32])src1);
        auVar31 = vpsubusw_avx2(*(undefined1 (*) [32])src1,*(undefined1 (*) [32])src0);
        auVar20 = vpmaxuw_avx2(auVar20,auVar31);
        auVar20 = vpaddusw_avx2(auVar20,auVar7);
        auVar20 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
        auVar20 = vpsrlw_avx2(auVar20,4);
        auVar31 = vpminsw_avx2(auVar20,auVar12);
        auVar20 = vpsubusw_avx2(*(undefined1 (*) [32])(*(undefined1 (*) [32])src0 + lVar5 * 2),
                                *(undefined1 (*) [32])
                                 (*(undefined1 (*) [32])src1 + (long)src1_stride * 2));
        auVar35 = vpsubusw_avx2(*(undefined1 (*) [32])
                                 (*(undefined1 (*) [32])src1 + (long)src1_stride * 2),
                                *(undefined1 (*) [32])(*(undefined1 (*) [32])src0 + lVar5 * 2));
        auVar20 = vpmaxuw_avx2(auVar20,auVar35);
        auVar20 = vpaddusw_avx2(auVar20,auVar7);
        auVar20 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
        auVar31 = vpsubw_avx2(auVar12,auVar31);
        auVar20 = vpsrlw_avx2(auVar20,4);
        auVar20 = vpminsw_avx2(auVar20,auVar12);
        auVar20 = vpsubw_avx2(auVar12,auVar20);
        auVar20 = vpackuswb_avx2(auVar31,auVar20);
        auVar20 = vpermq_avx2(auVar20,0xd8);
        *(undefined1 (*) [32])mask = auVar20;
        mask = (uint8_t *)((long)mask + 0x20);
        iVar1 = iVar1 + 2;
        src1 = (CONV_BUF_TYPE *)(*(undefined1 (*) [32])src1 + (long)(src1_stride * 2) * 2);
        src0 = (CONV_BUF_TYPE *)(*(undefined1 (*) [32])src0 + (long)(src0_stride * 2) * 2);
      } while (iVar1 < h);
      return;
    }
    if (w == 0x20) {
      iVar1 = 1;
      if (1 < h) {
        iVar1 = h;
      }
      pauVar4 = (undefined1 (*) [32])(src1 + 0x10);
      pauVar3 = (undefined1 (*) [32])(src0 + 0x10);
      auVar13._8_2_ = 0x1a;
      auVar13._0_8_ = 0x1a001a001a001a;
      auVar13._10_2_ = 0x1a;
      auVar13._12_2_ = 0x1a;
      auVar13._14_2_ = 0x1a;
      auVar13._16_2_ = 0x1a;
      auVar13._18_2_ = 0x1a;
      auVar13._20_2_ = 0x1a;
      auVar13._22_2_ = 0x1a;
      auVar13._24_2_ = 0x1a;
      auVar13._26_2_ = 0x1a;
      auVar13._28_2_ = 0x1a;
      auVar13._30_2_ = 0x1a;
      do {
        auVar20 = vpsubusw_avx2(pauVar3[-1],pauVar4[-1]);
        auVar31 = vpsubusw_avx2(pauVar4[-1],pauVar3[-1]);
        auVar20 = vpmaxuw_avx2(auVar20,auVar31);
        auVar20 = vpaddusw_avx2(auVar20,auVar7);
        auVar20 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
        auVar20 = vpsrlw_avx2(auVar20,4);
        auVar20 = vpminsw_avx2(auVar20,auVar13);
        auVar31 = vpsubw_avx2(auVar13,auVar20);
        auVar20 = vpsubusw_avx2(*pauVar3,*pauVar4);
        auVar35 = vpsubusw_avx2(*pauVar4,*pauVar3);
        auVar20 = vpmaxuw_avx2(auVar20,auVar35);
        auVar20 = vpaddusw_avx2(auVar20,auVar7);
        auVar20 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
        auVar20 = vpsrlw_avx2(auVar20,4);
        auVar20 = vpminsw_avx2(auVar20,auVar13);
        auVar20 = vpsubw_avx2(auVar13,auVar20);
        auVar20 = vpackuswb_avx2(auVar31,auVar20);
        auVar20 = vpermq_avx2(auVar20,0xd8);
        *(undefined1 (*) [32])mask = auVar20;
        mask = (uint8_t *)((long)mask + 0x20);
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + (long)src1_stride * 2);
        pauVar3 = (undefined1 (*) [32])(*pauVar3 + lVar5 * 2);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      return;
    }
    if (w == 0x40) {
      iVar1 = 1;
      if (1 < h) {
        iVar1 = h;
      }
      pauVar4 = (undefined1 (*) [32])(src1 + 0x30);
      pauVar3 = (undefined1 (*) [32])(src0 + 0x30);
      auVar9._8_2_ = 0x1a;
      auVar9._0_8_ = 0x1a001a001a001a;
      auVar9._10_2_ = 0x1a;
      auVar9._12_2_ = 0x1a;
      auVar9._14_2_ = 0x1a;
      auVar9._16_2_ = 0x1a;
      auVar9._18_2_ = 0x1a;
      auVar9._20_2_ = 0x1a;
      auVar9._22_2_ = 0x1a;
      auVar9._24_2_ = 0x1a;
      auVar9._26_2_ = 0x1a;
      auVar9._28_2_ = 0x1a;
      auVar9._30_2_ = 0x1a;
      do {
        auVar20 = vpsubusw_avx2(pauVar3[-3],pauVar4[-3]);
        auVar31 = vpsubusw_avx2(pauVar4[-3],pauVar3[-3]);
        auVar20 = vpmaxuw_avx2(auVar20,auVar31);
        auVar20 = vpaddusw_avx2(auVar20,auVar7);
        auVar20 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
        auVar20 = vpsrlw_avx2(auVar20,4);
        auVar31 = vpminsw_avx2(auVar20,auVar9);
        auVar20 = vpsubusw_avx2(pauVar3[-2],pauVar4[-2]);
        auVar35 = vpsubusw_avx2(pauVar4[-2],pauVar3[-2]);
        auVar20 = vpmaxuw_avx2(auVar20,auVar35);
        auVar20 = vpaddusw_avx2(auVar20,auVar7);
        auVar20 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
        auVar31 = vpsubw_avx2(auVar9,auVar31);
        auVar20 = vpsrlw_avx2(auVar20,4);
        auVar20 = vpminsw_avx2(auVar20,auVar9);
        auVar20 = vpsubw_avx2(auVar9,auVar20);
        auVar20 = vpackuswb_avx2(auVar31,auVar20);
        auVar31 = vpsubusw_avx2(pauVar3[-1],pauVar4[-1]);
        auVar35 = vpsubusw_avx2(pauVar4[-1],pauVar3[-1]);
        auVar31 = vpmaxuw_avx2(auVar31,auVar35);
        auVar31 = vpaddusw_avx2(auVar31,auVar7);
        auVar31 = vpsrlw_avx2(auVar31,ZEXT416(uVar2));
        auVar31 = vpsrlw_avx2(auVar31,4);
        auVar31 = vpminsw_avx2(auVar31,auVar9);
        auVar35 = vpsubw_avx2(auVar9,auVar31);
        auVar31 = vpsubusw_avx2(*pauVar3,*pauVar4);
        auVar50 = vpsubusw_avx2(*pauVar4,*pauVar3);
        auVar31 = vpmaxuw_avx2(auVar31,auVar50);
        auVar31 = vpaddusw_avx2(auVar31,auVar7);
        auVar31 = vpsrlw_avx2(auVar31,ZEXT416(uVar2));
        auVar31 = vpsrlw_avx2(auVar31,4);
        auVar31 = vpminsw_avx2(auVar31,auVar9);
        auVar31 = vpsubw_avx2(auVar9,auVar31);
        auVar31 = vpackuswb_avx2(auVar35,auVar31);
        auVar20 = vpermq_avx2(auVar20,0xd8);
        *(undefined1 (*) [32])mask = auVar20;
        auVar20 = vpermq_avx2(auVar31,0xd8);
        *(undefined1 (*) [32])((long)mask + 0x20) = auVar20;
        mask = (uint8_t *)((long)mask + 0x40);
        pauVar4 = (undefined1 (*) [32])(*pauVar4 + (long)src1_stride * 2);
        pauVar3 = (undefined1 (*) [32])(*pauVar3 + lVar5 * 2);
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
      return;
    }
  }
  iVar1 = 1;
  if (1 < h) {
    iVar1 = h;
  }
  pauVar4 = (undefined1 (*) [32])(src1 + 0x70);
  pauVar3 = (undefined1 (*) [32])(src0 + 0x70);
  auVar15._8_2_ = 0x1a;
  auVar15._0_8_ = 0x1a001a001a001a;
  auVar15._10_2_ = 0x1a;
  auVar15._12_2_ = 0x1a;
  auVar15._14_2_ = 0x1a;
  auVar15._16_2_ = 0x1a;
  auVar15._18_2_ = 0x1a;
  auVar15._20_2_ = 0x1a;
  auVar15._22_2_ = 0x1a;
  auVar15._24_2_ = 0x1a;
  auVar15._26_2_ = 0x1a;
  auVar15._28_2_ = 0x1a;
  auVar15._30_2_ = 0x1a;
  do {
    auVar20 = vpsubusw_avx2(pauVar3[-7],pauVar4[-7]);
    auVar31 = vpsubusw_avx2(pauVar4[-7],pauVar3[-7]);
    auVar20 = vpmaxuw_avx2(auVar20,auVar31);
    auVar31 = vpsubusw_avx2(pauVar3[-6],pauVar4[-6]);
    auVar35 = vpsubusw_avx2(pauVar4[-6],pauVar3[-6]);
    auVar31 = vpmaxuw_avx2(auVar31,auVar35);
    auVar20 = vpaddusw_avx2(auVar20,auVar7);
    auVar20 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
    auVar20 = vpsrlw_avx2(auVar20,4);
    auVar20 = vpminsw_avx2(auVar20,auVar15);
    auVar35 = vpsubw_avx2(auVar15,auVar20);
    auVar20 = vpaddusw_avx2(auVar31,auVar7);
    auVar20 = vpsrlw_avx2(auVar20,ZEXT416(uVar2));
    auVar20 = vpsrlw_avx2(auVar20,4);
    auVar20 = vpminsw_avx2(auVar20,auVar15);
    auVar20 = vpsubw_avx2(auVar15,auVar20);
    auVar20 = vpackuswb_avx2(auVar35,auVar20);
    auVar31 = vpsubusw_avx2(pauVar3[-5],pauVar4[-5]);
    auVar35 = vpsubusw_avx2(pauVar4[-5],pauVar3[-5]);
    auVar31 = vpmaxuw_avx2(auVar31,auVar35);
    auVar35 = vpsubusw_avx2(pauVar3[-4],pauVar4[-4]);
    auVar50 = vpsubusw_avx2(pauVar4[-4],pauVar3[-4]);
    auVar35 = vpmaxuw_avx2(auVar35,auVar50);
    auVar31 = vpaddusw_avx2(auVar31,auVar7);
    auVar8 = ZEXT416(uVar2);
    auVar31 = vpsrlw_avx2(auVar31,auVar8);
    auVar31 = vpsrlw_avx2(auVar31,4);
    auVar31 = vpminsw_avx2(auVar31,auVar15);
    auVar50 = vpsubw_avx2(auVar15,auVar31);
    auVar31 = vpaddusw_avx2(auVar35,auVar7);
    auVar31 = vpsrlw_avx2(auVar31,auVar8);
    auVar31 = vpsrlw_avx2(auVar31,4);
    auVar31 = vpminsw_avx2(auVar31,auVar15);
    auVar31 = vpsubw_avx2(auVar15,auVar31);
    auVar31 = vpackuswb_avx2(auVar50,auVar31);
    auVar35 = vpsubusw_avx2(pauVar3[-3],pauVar4[-3]);
    auVar50 = vpsubusw_avx2(pauVar4[-3],pauVar3[-3]);
    auVar35 = vpmaxuw_avx2(auVar35,auVar50);
    auVar50 = vpsubusw_avx2(pauVar3[-2],pauVar4[-2]);
    auVar53 = vpsubusw_avx2(pauVar4[-2],pauVar3[-2]);
    auVar50 = vpmaxuw_avx2(auVar50,auVar53);
    auVar35 = vpaddusw_avx2(auVar35,auVar7);
    auVar35 = vpsrlw_avx2(auVar35,auVar8);
    auVar35 = vpsrlw_avx2(auVar35,4);
    auVar35 = vpminsw_avx2(auVar35,auVar15);
    auVar53 = vpsubw_avx2(auVar15,auVar35);
    auVar35 = vpaddusw_avx2(auVar50,auVar7);
    auVar35 = vpsrlw_avx2(auVar35,auVar8);
    auVar35 = vpsrlw_avx2(auVar35,4);
    auVar35 = vpminsw_avx2(auVar35,auVar15);
    auVar35 = vpsubw_avx2(auVar15,auVar35);
    auVar35 = vpackuswb_avx2(auVar53,auVar35);
    auVar50 = vpsubusw_avx2(pauVar3[-1],pauVar4[-1]);
    auVar53 = vpsubusw_avx2(pauVar4[-1],pauVar3[-1]);
    auVar50 = vpmaxuw_avx2(auVar50,auVar53);
    auVar53 = vpsubusw_avx2(*pauVar3,*pauVar4);
    auVar23 = vpsubusw_avx2(*pauVar4,*pauVar3);
    auVar53 = vpmaxuw_avx2(auVar53,auVar23);
    auVar50 = vpaddusw_avx2(auVar50,auVar7);
    auVar50 = vpsrlw_avx2(auVar50,ZEXT416(uVar2));
    auVar50 = vpsrlw_avx2(auVar50,4);
    auVar50 = vpminsw_avx2(auVar50,auVar15);
    auVar23 = vpsubw_avx2(auVar15,auVar50);
    auVar50 = vpaddusw_avx2(auVar53,auVar7);
    auVar50 = vpsrlw_avx2(auVar50,ZEXT416(uVar2));
    auVar50 = vpsrlw_avx2(auVar50,4);
    auVar50 = vpminsw_avx2(auVar50,auVar15);
    auVar50 = vpsubw_avx2(auVar15,auVar50);
    auVar50 = vpackuswb_avx2(auVar23,auVar50);
    auVar20 = vpermq_avx2(auVar20,0xd8);
    *(undefined1 (*) [32])mask = auVar20;
    auVar20 = vpermq_avx2(auVar31,0xd8);
    *(undefined1 (*) [32])((long)mask + 0x20) = auVar20;
    auVar20 = vpermq_avx2(auVar35,0xd8);
    *(undefined1 (*) [32])((long)mask + 0x40) = auVar20;
    auVar20 = vpermq_avx2(auVar50,0xd8);
    *(undefined1 (*) [32])((long)mask + 0x60) = auVar20;
    mask = (uint8_t *)((long)mask + 0x80);
    pauVar4 = (undefined1 (*) [32])(*pauVar4 + (long)src1_stride * 2);
    pauVar3 = (undefined1 (*) [32])(*pauVar3 + lVar5 * 2);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_d16_avx2(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const CONV_BUF_TYPE *src0,
    int src0_stride, const CONV_BUF_TYPE *src1, int src1_stride, int h, int w,
    ConvolveParams *conv_params, int bd) {
  const int shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1 + (bd - 8);
  // When rounding constant is added, there is a possibility of overflow.
  // However that much precision is not required. Code should very well work for
  // other values of DIFF_FACTOR_LOG2 and AOM_BLEND_A64_MAX_ALPHA as well. But
  // there is a possibility of corner case bugs.
  assert(DIFF_FACTOR_LOG2 == 4);
  assert(AOM_BLEND_A64_MAX_ALPHA == 64);

  if (mask_type == DIFFWTD_38) {
    build_compound_diffwtd_mask_d16_avx2(mask, src0, src0_stride, src1,
                                         src1_stride, h, w, shift);
  } else {
    build_compound_diffwtd_mask_d16_inv_avx2(mask, src0, src0_stride, src1,
                                             src1_stride, h, w, shift);
  }
}